

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O1

int __thiscall
r_code::list<core::P<r_exec::_Fact>_>::remove(list<core::P<r_exec::_Fact>_> *this,char *__filename)

{
  pointer pcVar1;
  int extraout_EAX;
  long c;
  
  c = this->used_cells_head;
  if (c != list<core::P<r_exec::_Fact>>::end_iterator) {
    pcVar1 = (this->cells).
             super__Vector_base<r_code::list<core::P<r_exec::_Fact>_>::cell,_std::allocator<r_code::list<core::P<r_exec::_Fact>_>::cell>_>
             ._M_impl.super__Vector_impl_data._M_start;
    __filename = *(char **)__filename;
    do {
      if (pcVar1[c].data.object == (_Object *)__filename) {
        __erase(this,c);
        return extraout_EAX;
      }
      c = pcVar1[c].next;
    } while (c != list<core::P<r_exec::_Fact>>::end_iterator);
  }
  return (int)__filename;
}

Assistant:

void remove(const T &t)
    {
        const_iterator i(this, used_cells_head);

        for (; i != end_iterator; ++i) {
            if ((*i) == t) {
                erase(i);
                return;
            }
        }
    }